

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CS248::Collada::ColladaParser::uri_load(XMLElement *xml)

{
  char *pcVar1;
  mapped_type *ppXVar2;
  XMLElement *xml_00;
  string id;
  allocator local_31;
  key_type local_30;
  
  pcVar1 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
    std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
    ppXVar2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
                            *)sources_abi_cxx11_,&local_30);
    *ppXVar2 = xml;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  for (xml_00 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,(char *)0x0);
      xml_00 != (XMLElement *)0x0;
      xml_00 = tinyxml2::XMLNode::NextSiblingElement(&xml_00->super_XMLNode,(char *)0x0)) {
    uri_load(xml_00);
  }
  return;
}

Assistant:

void ColladaParser::uri_load(XMLElement* xml) {
  if (xml->Attribute("id")) {
    string id = xml->Attribute("id");
    sources[id] = xml;
  }

  XMLElement* child = xml->FirstChildElement();
  while (child) {
    uri_load(child);
    child = child->NextSiblingElement();
  }
}